

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug QtPrivate::printSequentialContainer<QList<QItemSelectionRange>>
                 (QDebug *debug,char *which,QList<QItemSelectionRange> *c)

{
  bool bVar1;
  QItemSelectionRange *in_RCX;
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff3f;
  QList<QItemSelectionRange> *in_stack_ffffffffffffff40;
  QItemSelectionRange *in_stack_ffffffffffffff48;
  QDebug *in_stack_ffffffffffffff50;
  QDebug *in_stack_ffffffffffffff58;
  QDebug *in_stack_ffffffffffffff88;
  QDebug local_50 [2];
  QItemSelectionRange *local_40;
  QDebug local_38 [2];
  QItemSelectionRange *local_28;
  const_iterator local_20;
  const_iterator local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RDI,in_stack_ffffffffffffff58);
  QDebug::nospace(in_RSI);
  QDebug::operator<<((QDebug *)in_RDI,(char *)in_RDX);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  local_18.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QItemSelectionRange>::begin(in_stack_ffffffffffffff40);
  local_20.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = (QItemSelectionRange *)QList<QItemSelectionRange>::end(in_stack_ffffffffffffff40);
  local_20 = (const_iterator)local_28;
  bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_18,(const_iterator)local_28)
  ;
  if (bVar1) {
    QDebug::QDebug(local_38,in_RSI);
    QList<QItemSelectionRange>::const_iterator::operator*(&local_18);
    ::operator<<(in_RDX,in_RCX);
    QDebug::~QDebug(in_stack_ffffffffffffff88);
    QDebug::~QDebug(in_stack_ffffffffffffff88);
    QList<QItemSelectionRange>::const_iterator::operator++(&local_18);
  }
  while( true ) {
    local_40 = local_20.i;
    bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_18,local_20);
    if (!bVar1) break;
    in_stack_ffffffffffffff50 = QDebug::operator<<((QDebug *)in_RDI,(char *)in_RDX);
    QDebug::QDebug(local_50,in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff48 = QList<QItemSelectionRange>::const_iterator::operator*(&local_18);
    ::operator<<(in_RDX,in_RCX);
    QDebug::~QDebug(in_stack_ffffffffffffff88);
    QDebug::~QDebug(in_stack_ffffffffffffff88);
    QList<QItemSelectionRange>::const_iterator::operator++(&local_18);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  QDebug::QDebug(in_stack_ffffffffffffff50,(QDebug *)in_stack_ffffffffffffff48);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}